

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_check_fp_number(png_const_charp string,png_size_t size,int *statep,png_size_tp whereami)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  char cVar8;
  long *unaff_RBX;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *unaff_RBP;
  png_size_t pVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  undefined8 uStack_30;
  
  cVar8 = (char)((ulong)statep >> 8);
  piVar6 = (int *)(ulong)(uint)*statep;
  pVar11 = *whereami;
  do {
    if (size <= pVar11) goto LAB_002c2348;
    iVar4 = 5;
    switch(string[pVar11]) {
    case '+':
      lVar9 = 4;
      break;
    case ',':
    case '/':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
      goto switchD_002c225f_caseD_2c;
    case '-':
      lVar9 = 0x84;
      break;
    case '.':
      lVar9 = 0x10;
      break;
    case '0':
      lVar9 = 8;
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      lVar9 = 0x108;
      break;
    case 'E':
switchD_002c225f_caseD_45:
      lVar9 = 0x20;
      break;
    default:
      if (string[pVar11] == 'e') goto switchD_002c225f_caseD_45;
      goto switchD_002c225f_caseD_2c;
    }
    uVar5 = (uint)piVar6;
    uVar14 = (uint)lVar9 & 0x3c;
    iVar2 = uVar14 + (uVar5 & 3);
    uVar12 = iVar2 - 4;
    if (uVar12 < 0xd) {
      bVar13 = (char)*(undefined4 *)(&DAT_00338f1c + (ulong)uVar12 * 4) + 0x1c;
      switch(iVar2) {
      case 5:
        halt_baddata();
      case 6:
        pbVar1 = (byte *)(piVar6 + 0x12);
        bVar3 = *pbVar1;
        *pbVar1 = *pbVar1 + bVar13;
        if (CARRY1(bVar3,bVar13)) {
          *(char *)(lVar9 + 0x43) = *(char *)(lVar9 + 0x43) + cVar8;
          halt_baddata();
        }
        iVar4 = (**(code **)statep)();
        return iVar4;
      case 7:
        iRam000000000bdff402 = iRam000000000bdff402 - (uint)lVar9;
        halt_baddata();
      }
      *piVar6 = *piVar6 + uVar5;
      *piVar6 = *piVar6 + uVar5;
      uVar12 = in(0xff);
      puVar7 = (uint *)(ulong)uVar12;
      uVar5 = *puVar7;
      uRamb4000136c4ffe5a1 = (char)piVar6;
      *puVar7 = *puVar7 + uVar12;
      if ((long)whereami + -1 != 0 && *puVar7 != 0) {
        iVar4 = (**(code **)((long)puVar7 + 0x1200014d))();
        return iVar4;
      }
      uVar14 = in(0xff);
      puVar7 = (uint *)(ulong)uVar14;
      *string = *string + cVar8 + CARRY4(uVar5,uVar12);
      uVar5 = *puVar7;
      *puVar7 = *puVar7 + uVar14;
      *(char *)((long)statep + 0x4fd8ffe5) =
           (*(char *)((long)statep + 0x4fd8ffe5) - (char)(uVar14 >> 8)) - CARRY4(uVar5,uVar14);
      uVar5 = *puVar7;
      *puVar7 = *puVar7 + uVar14;
      if (!CARRY4(uVar5,uVar14)) {
        uVar5 = in(0xff);
        piVar6 = (int *)(ulong)uVar5;
        *piVar6 = *piVar6 + uVar5;
        *(char *)((long)statep + 0x5008ffe5) = *(char *)((long)statep + 0x5008ffe5) << 1;
        *piVar6 = *piVar6 + uVar5;
        puVar10 = (undefined8 *)&stack0xffffffffffffffd8;
        cVar8 = '\x1e';
        do {
          unaff_RBP = unaff_RBP + -1;
          puVar10 = puVar10 + -1;
          *puVar10 = *unaff_RBP;
          cVar8 = cVar8 + -1;
        } while ('\0' < cVar8);
        halt_baddata();
      }
      *(char *)(size + 1) =
           (*(char *)(size + 1) - (char)((long)whereami + -1)) - CARRY4(uVar5,uVar14);
      in(0xff);
      *unaff_RBX = *unaff_RBX + pVar11;
      halt_baddata();
    }
    uVar14 = uVar14 | uVar5 & 3;
    if (((uVar14 == 0x20) || (uVar14 == 0x21)) && (((ulong)piVar6 & 8) != 0)) {
      piVar6 = (int *)(ulong)(uVar5 & 0x1c0 | 2);
      pVar11 = pVar11 + 1;
      iVar4 = 0;
    }
switchD_002c225f_caseD_2c:
  } while (iVar4 == 0);
  if (iVar4 == 5) {
LAB_002c2348:
    *statep = (uint)piVar6;
    *whereami = pVar11;
    piVar6 = (int *)(ulong)((uint)piVar6 >> 3 & 1);
  }
  return (int)piVar6;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, png_size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   png_size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}